

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

bool nlohmann::json_abi_v3_11_3::operator==(const_reference lhs,const_reference rhs)

{
  number_integer_t nVar1;
  value_t vVar2;
  value_t vVar3;
  double dVar4;
  __type _Var5;
  bool bVar6;
  
  vVar2 = (lhs->m_data).m_type;
  vVar3 = (rhs->m_data).m_type;
  if (vVar2 == vVar3) {
    switch(vVar2) {
    case null:
      bVar6 = true;
      break;
    case object:
      bVar6 = std::operator==(&((lhs->m_data).m_value.object)->_M_t,
                              &((rhs->m_data).m_value.object)->_M_t);
      break;
    case array:
      bVar6 = std::operator==((vector<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                               *)(lhs->m_data).m_value.object,
                              (vector<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                               *)(rhs->m_data).m_value.object);
      break;
    case string:
      _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (lhs->m_data).m_value.object,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (rhs->m_data).m_value.object);
      return _Var5;
    case boolean:
      bVar6 = (lhs->m_data).m_value.boolean == (rhs->m_data).m_value.boolean;
      break;
    case number_integer:
    case number_unsigned:
switchD_00116dc8_caseD_5:
      bVar6 = (lhs->m_data).m_value.object == (rhs->m_data).m_value.object;
      break;
    case number_float:
      dVar4 = (rhs->m_data).m_value.number_float;
LAB_00116e99:
      bVar6 = dVar4 == (lhs->m_data).m_value.number_float;
      goto LAB_00116ea4;
    case binary:
      bVar6 = byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::operator==((byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)(lhs->m_data).m_value.object,
                           (byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)(rhs->m_data).m_value.object);
      break;
    default:
      bVar6 = false;
    }
  }
  else {
    if (vVar2 == number_integer && (vVar3 ^ number_float) == null) {
      bVar6 = (double)(lhs->m_data).m_value.number_integer == (rhs->m_data).m_value.number_float;
    }
    else {
      if (vVar2 == number_float && (vVar3 ^ number_integer) == null) {
        dVar4 = (double)(rhs->m_data).m_value.number_integer;
        goto LAB_00116e99;
      }
      if (vVar2 == number_unsigned && (vVar3 ^ number_float) == null) {
        nVar1 = (lhs->m_data).m_value.number_integer;
        bVar6 = ((double)CONCAT44(0x45300000,(int)((ulong)nVar1 >> 0x20)) - 1.9342813113834067e+25)
                + ((double)CONCAT44(0x43300000,(int)nVar1) - 4503599627370496.0) ==
                (rhs->m_data).m_value.number_float;
      }
      else {
        if (vVar2 != number_float || (vVar3 ^ number_unsigned) != null) {
          if ((vVar2 != number_unsigned || (vVar3 ^ number_integer) != null) &&
             (vVar2 != number_integer || (vVar3 ^ number_unsigned) != null)) {
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::compares_unordered(lhs,rhs,false);
            return false;
          }
          goto switchD_00116dc8_caseD_5;
        }
        nVar1 = (rhs->m_data).m_value.number_integer;
        bVar6 = ((double)CONCAT44(0x45300000,(int)((ulong)nVar1 >> 0x20)) - 1.9342813113834067e+25)
                + ((double)CONCAT44(0x43300000,(int)nVar1) - 4503599627370496.0) ==
                (lhs->m_data).m_value.number_float;
      }
    }
LAB_00116ea4:
    bVar6 = (bool)(-bVar6 & 1);
  }
  return bVar6;
}

Assistant:

constexpr value_t type() const noexcept
    {
        return m_data.m_type;
    }